

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktComputeIndirectComputeDispatchTests.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::compute::anon_unknown_1::IndirectDispatchInstanceBufferUpload::iterate
          (TestStatus *__return_storage_ptr__,IndirectDispatchInstanceBufferUpload *this)

{
  deUint32 *pdVar1;
  pointer *ppVVar2;
  TestContext *pTVar3;
  TestLog *log;
  DeviceInterface *pDVar4;
  VkDevice pVVar5;
  Allocator *pAVar6;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
  *this_00;
  SharedPtrStateBase *pSVar7;
  VkAllocationCallbacks *pVVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined8 obj;
  long *plVar11;
  ulong uVar12;
  InstanceInterface *pIVar13;
  VkPhysicalDevice pVVar14;
  const_iterator cVar15;
  DescriptorPoolBuilder *this_01;
  Unique<vk::Handle<(vk::HandleType)22>_> *pUVar16;
  SharedPtrStateBase *pSVar17;
  deInt32 *pdVar18;
  ulong uVar19;
  pointer pDVar20;
  Allocation *pAVar21;
  uint *puVar22;
  pointer pVVar23;
  pointer pDVar24;
  long *plVar25;
  long lVar26;
  VkDeviceSize bufferSize;
  undefined4 *puVar27;
  uint uVar28;
  VkDeviceSize VVar29;
  VkCommandBuffer commandBuffer;
  VkDeviceSize VVar30;
  pointer pSVar31;
  bool bVar32;
  VkBufferMemoryBarrier ssboPostBarrier;
  Buffer local_520;
  DescriptorSetLayoutBuilder layoutBuilder;
  Buffer local_4a8;
  ScopedLogSection section;
  Deleter<vk::Handle<(vk::HandleType)14>_> DStack_470;
  VkCommandBuffer local_458;
  long *plStack_450;
  VkPhysicalDeviceType local_448;
  char cStack_444;
  char cStack_443;
  char cStack_442;
  char cStack_441;
  char acStack_440 [8];
  VkDescriptorBufferInfo resultDescriptorInfo;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
  descriptorSets;
  Deleter<vk::Handle<(vk::HandleType)16>_> DStack_400;
  VkDescriptorSetLayout local_3e8;
  Deleter<vk::Handle<(vk::HandleType)19>_> DStack_3e0;
  VkCommandPool local_3c8;
  Deleter<vk::Handle<(vk::HandleType)24>_> DStack_3c0;
  VkDescriptorPool local_3a8;
  Deleter<vk::Handle<(vk::HandleType)21>_> DStack_3a0;
  VkPipeline local_388;
  Deleter<vk::Handle<(vk::HandleType)18>_> DStack_380;
  VkPhysicalDeviceProperties deviceProperties;
  
  pTVar3 = this->m_context->m_testCtx;
  deviceProperties._0_8_ = pTVar3->m_log;
  pdVar1 = &deviceProperties.vendorID;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)pdVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)pdVar1,"GL_DISPATCH_INDIRECT_BUFFER size = ",0x23);
  std::ostream::_M_insert<unsigned_long>((ulong)pdVar1);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&deviceProperties,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)pdVar1);
  std::ios_base::~ios_base((ios_base *)(deviceProperties.deviceName + 100));
  log = pTVar3->m_log;
  ppVVar2 = &layoutBuilder.m_bindings.
             super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  layoutBuilder.m_bindings.
  super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)ppVVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&layoutBuilder,"Commands","");
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&deviceProperties);
  std::ostream::_M_insert<unsigned_long>((ulong)&deviceProperties);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&deviceProperties);
  std::ios_base::~ios_base((ios_base *)(deviceProperties.deviceName + 0x5c));
  plVar11 = (long *)std::__cxx11::string::replace((ulong)&local_4a8,0,(char *)0x0,0xb39fbb);
  pAVar21 = (Allocation *)(plVar11 + 2);
  if ((Allocation *)*plVar11 == pAVar21) {
    local_520.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal =
         (deUint64)pAVar21->_vptr_Allocation;
    local_520.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
         (DeviceInterface *)plVar11[3];
    local_520.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
    m_data.ptr = (Allocation *)&local_520.m_buffer;
  }
  else {
    local_520.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal =
         (deUint64)pAVar21->_vptr_Allocation;
    local_520.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
    m_data.ptr = (Allocation *)*plVar11;
  }
  local_520.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
  m_data._8_8_ = plVar11[1];
  *plVar11 = (long)pAVar21;
  plVar11[1] = 0;
  *(undefined1 *)(plVar11 + 2) = 0;
  plVar11 = (long *)std::__cxx11::string::append((char *)&local_520);
  plVar25 = plVar11 + 2;
  if ((long *)*plVar11 == plVar25) {
    ssboPostBarrier._16_8_ = *plVar25;
    ssboPostBarrier._24_8_ = plVar11[3];
    ssboPostBarrier._0_8_ = &ssboPostBarrier.srcAccessMask;
  }
  else {
    ssboPostBarrier._16_8_ = *plVar25;
    ssboPostBarrier._0_8_ = (long *)*plVar11;
  }
  ssboPostBarrier.pNext = (void *)plVar11[1];
  *plVar11 = (long)plVar25;
  plVar11[1] = 0;
  *(undefined1 *)(plVar11 + 2) = 0;
  tcu::ScopedLogSection::ScopedLogSection
            (&section,log,(string *)&layoutBuilder,(string *)&ssboPostBarrier);
  if ((VkAccessFlags *)ssboPostBarrier._0_8_ != &ssboPostBarrier.srcAccessMask) {
    operator_delete((void *)ssboPostBarrier._0_8_,ssboPostBarrier._16_8_ + 1);
  }
  if (local_520.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
      m_data.ptr != (Allocation *)&local_520.m_buffer) {
    operator_delete(local_520.m_allocation.
                    super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr
                    ,local_520.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
                     m_internal + 1);
  }
  if (local_4a8.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
      m_data.ptr != (Allocation *)&local_4a8.m_buffer) {
    operator_delete(local_4a8.m_allocation.
                    super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr
                    ,local_4a8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
                     m_internal + 1);
  }
  if (layoutBuilder.m_bindings.
      super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)ppVVar2) {
    operator_delete(layoutBuilder.m_bindings.
                    super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (ulong)((long)&(layoutBuilder.m_bindings.
                                    super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage)->binding + 1
                           ));
  }
  if ((this->m_dispatchCommands).
      super__Vector_base<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->m_dispatchCommands).
      super__Vector_base<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    pdVar1 = &deviceProperties.vendorID;
    uVar12 = 0;
    uVar19 = 1;
    do {
      deviceProperties._0_8_ = pTVar3->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)pdVar1);
      std::ostream::_M_insert<unsigned_long>((ulong)pdVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)pdVar1,": ",2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)pdVar1,"offset = ",9);
      std::ostream::_M_insert<long>((long)pdVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)pdVar1,", numWorkGroups = ",0x12);
      tcu::operator<<((ostream *)pdVar1,
                      &(this->m_dispatchCommands).
                       super__Vector_base<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar12].m_numWorkGroups);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&deviceProperties,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)pdVar1);
      std::ios_base::~ios_base((ios_base *)(deviceProperties.deviceName + 100));
      uVar12 = ((long)(this->m_dispatchCommands).
                      super__Vector_base<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->m_dispatchCommands).
                      super__Vector_base<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
      bVar32 = uVar19 <= uVar12;
      lVar26 = uVar12 - uVar19;
      uVar12 = uVar19;
      uVar19 = (ulong)((int)uVar19 + 1);
    } while (bVar32 && lVar26 != 0);
  }
  tcu::TestLog::endSection(section.m_log);
  pIVar13 = Context::getInstanceInterface(this->m_context);
  pVVar14 = Context::getPhysicalDevice(this->m_context);
  (*pIVar13->_vptr_InstanceInterface[5])(pIVar13,pVVar14,&deviceProperties);
  VVar29 = 0x10;
  if ((deviceProperties.limits.minStorageBufferOffsetAlignment != 0) &&
     (auVar9._8_8_ = 0, auVar9._0_8_ = deviceProperties.limits.minStorageBufferOffsetAlignment,
     auVar10 = ZEXT816(0) << 0x40 | ZEXT816(0x10), SUB168(auVar10 % auVar9,0) != 0)) {
    VVar29 = (SUB168(auVar10 / auVar9,0) + 1) *
             deviceProperties.limits.minStorageBufferOffsetAlignment;
  }
  bufferSize = (uint)((int)((ulong)((long)(this->m_dispatchCommands).
                                          super__Vector_base<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(this->m_dispatchCommands).
                                         super__Vector_base<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                     -0x55555555) * VVar29;
  pDVar4 = this->m_device_interface;
  pVVar5 = this->m_device;
  pAVar6 = this->m_allocator;
  makeBufferCreateInfo((VkBufferCreateInfo *)&deviceProperties,bufferSize,0x20);
  compute::Buffer::Buffer
            (&local_520,pDVar4,pVVar5,pAVar6,(VkBufferCreateInfo *)&deviceProperties,
             (MemoryRequirement)0x1);
  pDVar20 = (this->m_dispatchCommands).
            super__Vector_base<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
            ._M_impl.super__Vector_impl_data._M_start;
  lVar26 = (long)(this->m_dispatchCommands).
                 super__Vector_base<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pDVar20;
  if (lVar26 != 0) {
    uVar12 = (lVar26 >> 3) * -0x5555555555555555;
    puVar27 = (undefined4 *)
              ((long)&((VkAllocationCallbacks *)
                      (local_520.m_allocation.
                       super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
                      ptr)->m_hostPtr)->pfnAllocation + 4);
    puVar22 = (pDVar20->m_numWorkGroups).m_data + 2;
    uVar28 = 1;
    do {
      puVar27[-3] = ((UVec3 *)(puVar22 + -2))->m_data[0];
      puVar27[-2] = puVar22[-1];
      puVar27[-1] = *puVar22;
      *puVar27 = 0;
      uVar19 = (ulong)uVar28;
      puVar27 = (undefined4 *)((long)puVar27 + VVar29);
      puVar22 = puVar22 + 6;
      uVar28 = uVar28 + 1;
    } while (uVar19 <= uVar12 && uVar12 - uVar19 != 0);
  }
  ::vk::flushMappedMemoryRange
            (this->m_device_interface,this->m_device,
             (VkDeviceMemory)
             ((Deleter<vk::Handle<(vk::HandleType)8>_> *)
             &(local_520.m_allocation.
               super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
              m_memory)->m_deviceIface,
             (VkDeviceSize)
             (local_520.m_allocation.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_offset,bufferSize);
  ppVVar2 = &layoutBuilder.m_bindings.
             super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  pDVar4 = this->m_device_interface;
  pVVar5 = this->m_device;
  this_00 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
             *)this->m_context->m_progCollection;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &ssboPostBarrier,"indirect_dispatch_",&this->m_name);
  plVar11 = (long *)std::__cxx11::string::append((char *)&ssboPostBarrier);
  pVVar23 = (pointer)(plVar11 + 2);
  if ((pointer)*plVar11 == pVVar23) {
    layoutBuilder.m_bindings.
    super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = *(pointer *)pVVar23;
    layoutBuilder.m_immutableSamplerInfos.
    super__Vector_base<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo,_std::allocator<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)plVar11[3];
    layoutBuilder.m_bindings.
    super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)ppVVar2;
  }
  else {
    layoutBuilder.m_bindings.
    super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = *(pointer *)pVVar23;
    layoutBuilder.m_bindings.
    super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)*plVar11;
  }
  layoutBuilder.m_bindings.
  super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)plVar11[1];
  *plVar11 = (long)pVVar23;
  plVar11[1] = 0;
  *(undefined1 *)(plVar11 + 2) = 0;
  cVar15 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
           ::find(this_00,(key_type *)&layoutBuilder);
  ::vk::createShaderModule
            ((Move<vk::Handle<(vk::HandleType)14>_> *)&deviceProperties,pDVar4,pVVar5,
             *(ProgramBinary **)(cVar15._M_node + 2),0);
  DStack_470.m_device = (VkDevice)deviceProperties._16_8_;
  DStack_470.m_allocator = (VkAllocationCallbacks *)deviceProperties.deviceName._4_8_;
  section.m_log = (TestLog *)deviceProperties._0_8_;
  DStack_470.m_deviceIface = (DeviceInterface *)deviceProperties._8_8_;
  deviceProperties.apiVersion = 0;
  deviceProperties.driverVersion = 0;
  deviceProperties.vendorID = 0;
  deviceProperties.deviceID = 0;
  deviceProperties.deviceType = VK_PHYSICAL_DEVICE_TYPE_OTHER;
  deviceProperties.deviceName[0] = '\0';
  deviceProperties.deviceName[1] = '\0';
  deviceProperties.deviceName[2] = '\0';
  deviceProperties.deviceName[3] = '\0';
  deviceProperties.deviceName[4] = '\0';
  deviceProperties.deviceName[5] = '\0';
  deviceProperties.deviceName[6] = '\0';
  deviceProperties.deviceName[7] = '\0';
  deviceProperties.deviceName[8] = '\0';
  deviceProperties.deviceName[9] = '\0';
  deviceProperties.deviceName[10] = '\0';
  deviceProperties.deviceName[0xb] = '\0';
  if (layoutBuilder.m_bindings.
      super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)ppVVar2) {
    operator_delete(layoutBuilder.m_bindings.
                    super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (ulong)((long)&(layoutBuilder.m_bindings.
                                    super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage)->binding + 1
                           ));
  }
  if ((VkAccessFlags *)ssboPostBarrier._0_8_ != &ssboPostBarrier.srcAccessMask) {
    operator_delete((void *)ssboPostBarrier._0_8_,ssboPostBarrier._16_8_ + 1);
  }
  ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder(&layoutBuilder);
  ::vk::DescriptorSetLayoutBuilder::addBinding
            (&layoutBuilder,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,1,0x20,(VkSampler *)0x0);
  ::vk::DescriptorSetLayoutBuilder::build
            ((Move<vk::Handle<(vk::HandleType)19>_> *)&deviceProperties,&layoutBuilder,
             this->m_device_interface,this->m_device,0);
  DStack_3e0.m_device = (VkDevice)deviceProperties._16_8_;
  DStack_3e0.m_allocator = (VkAllocationCallbacks *)deviceProperties.deviceName._4_8_;
  local_3e8.m_internal._0_4_ = deviceProperties.apiVersion;
  local_3e8.m_internal._4_4_ = deviceProperties.driverVersion;
  DStack_3e0.m_deviceIface = (DeviceInterface *)deviceProperties._8_8_;
  makePipelineLayout((Move<vk::Handle<(vk::HandleType)16>_> *)&deviceProperties,
                     this->m_device_interface,this->m_device,
                     (VkDescriptorSetLayout)deviceProperties._0_8_);
  obj = deviceProperties._0_8_;
  DStack_400.m_device = (VkDevice)deviceProperties._16_8_;
  DStack_400.m_allocator = (VkAllocationCallbacks *)deviceProperties.deviceName._4_8_;
  DStack_400.m_deviceIface = (DeviceInterface *)deviceProperties._8_8_;
  makeComputePipeline((Move<vk::Handle<(vk::HandleType)18>_> *)&deviceProperties,
                      this->m_device_interface,this->m_device,
                      (VkPipelineLayout)deviceProperties._0_8_,(VkShaderModule)section.m_log);
  DStack_380.m_device = (VkDevice)deviceProperties._16_8_;
  DStack_380.m_allocator = (VkAllocationCallbacks *)deviceProperties.deviceName._4_8_;
  local_388.m_internal._0_4_ = deviceProperties.apiVersion;
  local_388.m_internal._4_4_ = deviceProperties.driverVersion;
  DStack_380.m_deviceIface = (DeviceInterface *)deviceProperties._8_8_;
  ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder((DescriptorPoolBuilder *)&ssboPostBarrier);
  this_01 = ::vk::DescriptorPoolBuilder::addType
                      ((DescriptorPoolBuilder *)&ssboPostBarrier,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,
                       (int)((ulong)((long)(this->m_dispatchCommands).
                                           super__Vector_base<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(this->m_dispatchCommands).
                                          super__Vector_base<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
                                          ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                       -0x55555555);
  ::vk::DescriptorPoolBuilder::build
            ((Move<vk::Handle<(vk::HandleType)21>_> *)&deviceProperties,this_01,
             this->m_device_interface,this->m_device,1,
             (int)((ulong)((long)(this->m_dispatchCommands).
                                 super__Vector_base<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->m_dispatchCommands).
                                super__Vector_base<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555);
  DStack_3a0.m_device = (VkDevice)deviceProperties._16_8_;
  DStack_3a0.m_allocator = (VkAllocationCallbacks *)deviceProperties.deviceName._4_8_;
  local_3a8.m_internal._0_4_ = deviceProperties.apiVersion;
  local_3a8.m_internal._4_4_ = deviceProperties.driverVersion;
  DStack_3a0.m_deviceIface = (DeviceInterface *)deviceProperties._8_8_;
  deviceProperties.apiVersion = 0;
  deviceProperties.driverVersion = 0;
  deviceProperties.vendorID = 0;
  deviceProperties.deviceID = 0;
  deviceProperties.deviceType = VK_PHYSICAL_DEVICE_TYPE_OTHER;
  deviceProperties.deviceName[0] = '\0';
  deviceProperties.deviceName[1] = '\0';
  deviceProperties.deviceName[2] = '\0';
  deviceProperties.deviceName[3] = '\0';
  deviceProperties.deviceName[4] = '\0';
  deviceProperties.deviceName[5] = '\0';
  deviceProperties.deviceName[6] = '\0';
  deviceProperties.deviceName[7] = '\0';
  deviceProperties.deviceName[8] = '\0';
  deviceProperties.deviceName[9] = '\0';
  deviceProperties.deviceName[10] = '\0';
  deviceProperties.deviceName[0xb] = '\0';
  if (ssboPostBarrier._0_8_ != 0) {
    operator_delete((void *)ssboPostBarrier._0_8_,ssboPostBarrier._16_8_ - ssboPostBarrier._0_8_);
  }
  makeBufferMemoryBarrier
            (&ssboPostBarrier,0x40,0x2000,
             (VkBuffer)
             local_520.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
             m_internal,0,bufferSize);
  makeCommandPool((Move<vk::Handle<(vk::HandleType)24>_> *)&deviceProperties,
                  this->m_device_interface,this->m_device,this->m_queueFamilyIndex);
  DStack_3c0.m_device = (VkDevice)deviceProperties._16_8_;
  DStack_3c0.m_allocator = (VkAllocationCallbacks *)deviceProperties.deviceName._4_8_;
  local_3c8.m_internal._0_4_ = deviceProperties.apiVersion;
  local_3c8.m_internal._4_4_ = deviceProperties.driverVersion;
  DStack_3c0.m_deviceIface = (DeviceInterface *)deviceProperties._8_8_;
  ::vk::allocateCommandBuffer
            ((Move<vk::VkCommandBuffer_s_*> *)&deviceProperties,this->m_device_interface,
             this->m_device,(VkCommandPool)deviceProperties._0_8_,VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  commandBuffer = (VkCommandBuffer)deviceProperties._0_8_;
  local_448 = deviceProperties.deviceType;
  cStack_444 = deviceProperties.deviceName[0];
  cStack_443 = deviceProperties.deviceName[1];
  cStack_442 = deviceProperties.deviceName[2];
  cStack_441 = deviceProperties.deviceName[3];
  acStack_440[0] = deviceProperties.deviceName[4];
  acStack_440[1] = deviceProperties.deviceName[5];
  acStack_440[2] = deviceProperties.deviceName[6];
  acStack_440[3] = deviceProperties.deviceName[7];
  acStack_440[4] = deviceProperties.deviceName[8];
  acStack_440[5] = deviceProperties.deviceName[9];
  acStack_440[6] = deviceProperties.deviceName[10];
  acStack_440[7] = deviceProperties.deviceName[0xb];
  local_458 = (VkCommandBuffer)deviceProperties._0_8_;
  plStack_450 = (long *)deviceProperties._8_8_;
  beginCommandBuffer(this->m_device_interface,(VkCommandBuffer)deviceProperties._0_8_);
  pDVar4 = this->m_device_interface;
  pVVar5 = this->m_device;
  pAVar6 = this->m_allocator;
  makeBufferCreateInfo((VkBufferCreateInfo *)&deviceProperties,this->m_bufferSize,0x120);
  compute::Buffer::Buffer
            (&local_4a8,pDVar4,pVVar5,pAVar6,(VkBufferCreateInfo *)&deviceProperties,
             (MemoryRequirement)0x1);
  (*(this->super_TestInstance)._vptr_TestInstance[3])(this,commandBuffer,&local_4a8);
  (*this->m_device_interface->_vptr_DeviceInterface[0x4c])
            (this->m_device_interface,commandBuffer,1,local_388.m_internal);
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
  ::vector(&descriptorSets,
           ((long)(this->m_dispatchCommands).
                  super__Vector_base<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->m_dispatchCommands).
                  super__Vector_base<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555,
           (allocator_type *)&deviceProperties);
  if ((this->m_dispatchCommands).
      super__Vector_base<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->m_dispatchCommands).
      super__Vector_base<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar28 = 1;
    uVar12 = 0;
    VVar30 = 0;
    do {
      pUVar16 = (Unique<vk::Handle<(vk::HandleType)22>_> *)operator_new(0x20);
      makeDescriptorSet((Move<vk::Handle<(vk::HandleType)22>_> *)&deviceProperties,
                        this->m_device_interface,this->m_device,local_3a8,local_3e8);
      (pUVar16->super_RefBase<vk::Handle<(vk::HandleType)22>_>).m_data.deleter.m_device =
           (VkDevice)deviceProperties._16_8_;
      (pUVar16->super_RefBase<vk::Handle<(vk::HandleType)22>_>).m_data.deleter.m_pool.m_internal =
           deviceProperties.deviceName._4_8_;
      (pUVar16->super_RefBase<vk::Handle<(vk::HandleType)22>_>).m_data.object.m_internal =
           deviceProperties._0_8_;
      (pUVar16->super_RefBase<vk::Handle<(vk::HandleType)22>_>).m_data.deleter.m_deviceIface =
           (DeviceInterface *)deviceProperties._8_8_;
      deviceProperties.apiVersion = 0;
      deviceProperties.driverVersion = 0;
      deviceProperties.vendorID = 0;
      deviceProperties.deviceID = 0;
      deviceProperties.deviceType = VK_PHYSICAL_DEVICE_TYPE_OTHER;
      deviceProperties.deviceName[0] = '\0';
      deviceProperties.deviceName[1] = '\0';
      deviceProperties.deviceName[2] = '\0';
      deviceProperties.deviceName[3] = '\0';
      deviceProperties.deviceName[4] = '\0';
      deviceProperties.deviceName[5] = '\0';
      deviceProperties.deviceName[6] = '\0';
      deviceProperties.deviceName[7] = '\0';
      deviceProperties.deviceName[8] = '\0';
      deviceProperties.deviceName[9] = '\0';
      deviceProperties.deviceName[10] = '\0';
      deviceProperties.deviceName[0xb] = '\0';
      pSVar17 = (SharedPtrStateBase *)operator_new(0x20);
      pSVar17->strongRefCount = 0;
      pSVar17->weakRefCount = 0;
      pSVar17->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00d24b90;
      pSVar17[1]._vptr_SharedPtrStateBase = (_func_int **)pUVar16;
      pSVar17->strongRefCount = 1;
      pSVar17->weakRefCount = 1;
      pSVar7 = descriptorSets.
               super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar12].m_state;
      if (pSVar7 != pSVar17) {
        pSVar31 = descriptorSets.
                  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + uVar12;
        if (pSVar7 != (SharedPtrStateBase *)0x0) {
          LOCK();
          pdVar18 = &pSVar7->strongRefCount;
          *pdVar18 = *pdVar18 + -1;
          UNLOCK();
          if (*pdVar18 == 0) {
            pSVar31->m_ptr = (Unique<vk::Handle<(vk::HandleType)22>_> *)0x0;
            (*pSVar31->m_state->_vptr_SharedPtrStateBase[2])();
          }
          LOCK();
          pdVar18 = &pSVar31->m_state->weakRefCount;
          *pdVar18 = *pdVar18 + -1;
          UNLOCK();
          if (*pdVar18 == 0) {
            if (pSVar31->m_state != (SharedPtrStateBase *)0x0) {
              (*pSVar31->m_state->_vptr_SharedPtrStateBase[1])();
            }
            pSVar31->m_state = (SharedPtrStateBase *)0x0;
          }
        }
        pSVar31->m_ptr = pUVar16;
        pSVar31->m_state = pSVar17;
        LOCK();
        pSVar17->strongRefCount = pSVar17->strongRefCount + 1;
        UNLOCK();
        LOCK();
        pdVar18 = &pSVar31->m_state->weakRefCount;
        *pdVar18 = *pdVar18 + 1;
        UNLOCK();
      }
      pdVar18 = &pSVar17->strongRefCount;
      LOCK();
      *pdVar18 = *pdVar18 + -1;
      UNLOCK();
      if (*pdVar18 == 0) {
        (*pSVar17->_vptr_SharedPtrStateBase[2])(pSVar17);
      }
      pdVar18 = &pSVar17->weakRefCount;
      LOCK();
      *pdVar18 = *pdVar18 + -1;
      UNLOCK();
      if (*pdVar18 == 0) {
        (*pSVar17->_vptr_SharedPtrStateBase[1])(pSVar17);
      }
      if (deviceProperties._0_8_ != 0) {
        resultDescriptorInfo.buffer.m_internal._0_4_ = deviceProperties.apiVersion;
        resultDescriptorInfo.buffer.m_internal._4_4_ = deviceProperties.driverVersion;
        (**(code **)(*(long *)deviceProperties._8_8_ + 0x1e8))
                  (deviceProperties._8_8_,deviceProperties._16_8_,deviceProperties.deviceName._4_8_,
                   1,&resultDescriptorInfo);
      }
      resultDescriptorInfo.buffer.m_internal =
           local_520.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal
      ;
      resultDescriptorInfo.offset = VVar30;
      resultDescriptorInfo.range = VVar29;
      ::vk::DescriptorSetUpdateBuilder::DescriptorSetUpdateBuilder
                ((DescriptorSetUpdateBuilder *)&deviceProperties);
      ::vk::DescriptorSetUpdateBuilder::write
                ((DescriptorSetUpdateBuilder *)&deviceProperties,
                 (int)((descriptorSets.
                        super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar12].m_ptr)->
                      super_RefBase<vk::Handle<(vk::HandleType)22>_>).m_data.object.m_internal,
                 (void *)0x0,0);
      ::vk::DescriptorSetUpdateBuilder::update
                ((DescriptorSetUpdateBuilder *)&deviceProperties,this->m_device_interface,
                 this->m_device);
      commandBuffer = local_458;
      (*this->m_device_interface->_vptr_DeviceInterface[0x56])
                (this->m_device_interface,local_458,1,obj,0,1,
                 descriptorSets.
                 super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar12].m_ptr,0,0);
      (*this->m_device_interface->_vptr_DeviceInterface[0x5e])
                (this->m_device_interface,commandBuffer,
                 local_4a8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
                 m_internal,
                 (this->m_dispatchCommands).
                 super__Vector_base<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar12].m_offset);
      if (deviceProperties.deviceName._28_8_ != 0) {
        operator_delete((void *)deviceProperties.deviceName._28_8_,
                        deviceProperties.deviceName._44_8_ - deviceProperties.deviceName._28_8_);
      }
      if (deviceProperties.deviceName._4_8_ != 0) {
        operator_delete((void *)deviceProperties.deviceName._4_8_,
                        deviceProperties.deviceName._20_8_ - deviceProperties.deviceName._4_8_);
      }
      VVar30 = VVar30 + VVar29;
      std::
      vector<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
      ::~vector((vector<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
                 *)&deviceProperties);
      uVar12 = (ulong)uVar28;
      uVar19 = ((long)(this->m_dispatchCommands).
                      super__Vector_base<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->m_dispatchCommands).
                      super__Vector_base<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
      uVar28 = uVar28 + 1;
    } while (uVar12 <= uVar19 && uVar19 - uVar12 != 0);
  }
  (*this->m_device_interface->_vptr_DeviceInterface[0x6d])
            (this->m_device_interface,commandBuffer,0x800,0x4000,0,0,0,1,&ssboPostBarrier,0,0);
  endCommandBuffer(this->m_device_interface,commandBuffer);
  submitCommandsAndWait(this->m_device_interface,this->m_device,this->m_queue,commandBuffer);
  pAVar21 = local_520.m_allocation.
            super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  ::vk::invalidateMappedMemoryRange
            (this->m_device_interface,this->m_device,
             (VkDeviceMemory)
             ((Deleter<vk::Handle<(vk::HandleType)8>_> *)
             &(local_520.m_allocation.
               super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
              m_memory)->m_deviceIface,
             (VkDeviceSize)
             (local_520.m_allocation.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_offset,bufferSize);
  pDVar20 = (this->m_dispatchCommands).
            super__Vector_base<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pDVar24 = (this->m_dispatchCommands).
            super__Vector_base<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (pDVar24 == pDVar20) {
LAB_00719d6e:
    deviceProperties._0_8_ = &deviceProperties.deviceType;
    std::__cxx11::string::_M_construct<char_const*>((string *)&deviceProperties,"Pass","");
    __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
    (__return_storage_ptr__->m_description)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_description,deviceProperties._0_8_,
               deviceProperties._8_8_ + deviceProperties._0_8_);
  }
  else {
    pVVar8 = (VkAllocationCallbacks *)pAVar21->m_hostPtr;
    uVar12 = 0;
    bVar32 = false;
    uVar28 = 0;
    do {
      uVar19 = ((long)pDVar24 - (long)pDVar20 >> 3) * -0x5555555555555555;
      while (uVar28 = uVar28 + 1,
            *(int *)((long)&pVVar8->pfnAllocation + uVar12 * VVar29 + 4) ==
            pDVar20[uVar12].m_numWorkGroups.m_data[0] *
            (this->m_workGroupSize).m_data[1] * (this->m_workGroupSize).m_data[0] *
            (this->m_workGroupSize).m_data[2] * pDVar20[uVar12].m_numWorkGroups.m_data[1] *
            pDVar20[uVar12].m_numWorkGroups.m_data[2]) {
        uVar12 = (ulong)uVar28;
        if (uVar19 < uVar12 || uVar19 - uVar12 == 0) {
          if (!bVar32) goto LAB_00719d6e;
          goto LAB_00719d16;
        }
      }
      deviceProperties._0_8_ = this->m_context->m_testCtx->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&deviceProperties.vendorID);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&deviceProperties.vendorID,"ERROR: got invalid result for invocation ",
                 0x29);
      std::ostream::_M_insert<unsigned_long>((ulong)&deviceProperties.vendorID);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&deviceProperties.vendorID,": got numPassed = ",0x12);
      std::ostream::_M_insert<unsigned_long>((ulong)&deviceProperties.vendorID);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&deviceProperties.vendorID,", expected ",0xb);
      std::ostream::_M_insert<unsigned_long>((ulong)&deviceProperties.vendorID);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&deviceProperties,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&deviceProperties.vendorID);
      std::ios_base::~ios_base((ios_base *)(deviceProperties.deviceName + 100));
      pDVar20 = (this->m_dispatchCommands).
                super__Vector_base<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pDVar24 = (this->m_dispatchCommands).
                super__Vector_base<vkt::compute::(anonymous_namespace)::DispatchCommand,_std::allocator<vkt::compute::(anonymous_namespace)::DispatchCommand>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      uVar12 = (ulong)uVar28;
      uVar19 = ((long)pDVar24 - (long)pDVar20 >> 3) * -0x5555555555555555;
      bVar32 = true;
    } while (uVar12 <= uVar19 && uVar19 - uVar12 != 0);
LAB_00719d16:
    deviceProperties._0_8_ = &deviceProperties.deviceType;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&deviceProperties,"Invalid values in result buffer","");
    __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
    (__return_storage_ptr__->m_description)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_description,deviceProperties._0_8_,
               deviceProperties._8_8_ + deviceProperties._0_8_);
  }
  if ((VkPhysicalDeviceType *)deviceProperties._0_8_ != &deviceProperties.deviceType) {
    operator_delete((void *)deviceProperties._0_8_,deviceProperties._16_8_ + 1);
  }
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
  ::~vector(&descriptorSets);
  if (local_4a8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal != 0
     ) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              (&local_4a8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter,
               (VkBuffer)
               local_4a8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
               m_internal);
  }
  local_4a8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  local_4a8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  local_4a8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal = 0;
  local_4a8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  if (local_4a8.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
      m_data.ptr != (Allocation *)0x0) {
    (*(local_4a8.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
       m_data.ptr)->_vptr_Allocation[1])();
  }
  if (commandBuffer != (VkCommandBuffer)0x0) {
    deviceProperties._0_8_ = commandBuffer;
    (**(code **)(*plStack_450 + 0x240))(plStack_450,_local_448,acStack_440,1);
  }
  if (local_3c8.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()(&DStack_3c0,local_3c8);
  }
  if (local_3a8.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)21>_>::operator()(&DStack_3a0,local_3a8);
  }
  if (local_388.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()(&DStack_380,local_388);
  }
  if (obj != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)16>_>::operator()
              (&DStack_400,(VkPipelineLayout)obj);
  }
  if (local_3e8.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)19>_>::operator()(&DStack_3e0,local_3e8);
  }
  if (layoutBuilder.m_immutableSamplers.
      super__Vector_base<vk::Handle<(vk::HandleType)20>,_std::allocator<vk::Handle<(vk::HandleType)20>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(layoutBuilder.m_immutableSamplers.
                    super__Vector_base<vk::Handle<(vk::HandleType)20>,_std::allocator<vk::Handle<(vk::HandleType)20>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)layoutBuilder.m_immutableSamplers.
                          super__Vector_base<vk::Handle<(vk::HandleType)20>,_std::allocator<vk::Handle<(vk::HandleType)20>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)layoutBuilder.m_immutableSamplers.
                          super__Vector_base<vk::Handle<(vk::HandleType)20>,_std::allocator<vk::Handle<(vk::HandleType)20>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (layoutBuilder.m_immutableSamplerInfos.
      super__Vector_base<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo,_std::allocator<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(layoutBuilder.m_immutableSamplerInfos.
                    super__Vector_base<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo,_std::allocator<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)layoutBuilder.m_immutableSamplerInfos.
                          super__Vector_base<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo,_std::allocator<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)layoutBuilder.m_immutableSamplerInfos.
                          super__Vector_base<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo,_std::allocator<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (layoutBuilder.m_bindings.
      super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(layoutBuilder.m_bindings.
                    super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)layoutBuilder.m_bindings.
                          super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)layoutBuilder.m_bindings.
                          super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (section.m_log != (TestLog *)0x0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()
              (&DStack_470,(VkShaderModule)section.m_log);
  }
  if (local_520.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal != 0
     ) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              (&local_520.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter,
               (VkBuffer)
               local_520.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
               m_internal);
  }
  local_520.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  local_520.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  local_520.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal = 0;
  local_520.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  if (local_520.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
      m_data.ptr != (Allocation *)0x0) {
    (**(code **)((((RefBase<vk::Handle<(vk::HandleType)8>_> *)
                  &(local_520.m_allocation.
                    super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr
                   )->_vptr_Allocation)->m_data).object.m_internal + 8))();
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus IndirectDispatchInstanceBufferUpload::iterate (void)
{
	tcu::TestContext& testCtx = m_context.getTestContext();

	testCtx.getLog() << tcu::TestLog::Message << "GL_DISPATCH_INDIRECT_BUFFER size = " << m_bufferSize << tcu::TestLog::EndMessage;
	{
		tcu::ScopedLogSection section(testCtx.getLog(), "Commands", "Indirect Dispatch Commands (" + de::toString(m_dispatchCommands.size()) + " in total)");

		for (deUint32 cmdNdx = 0; cmdNdx < m_dispatchCommands.size(); ++cmdNdx)
		{
			testCtx.getLog()
				<< tcu::TestLog::Message
				<< cmdNdx << ": " << "offset = " << m_dispatchCommands[cmdNdx].m_offset << ", numWorkGroups = " << m_dispatchCommands[cmdNdx].m_numWorkGroups
				<< tcu::TestLog::EndMessage;
		}
	}

	// Create result buffer
	const vk::VkDeviceSize resultBlockSize = getResultBlockAlignedSize(m_context.getInstanceInterface(), m_context.getPhysicalDevice(), RESULT_BLOCK_BASE_SIZE);
	const vk::VkDeviceSize resultBufferSize = resultBlockSize * (deUint32)m_dispatchCommands.size();

	Buffer resultBuffer(
		m_device_interface, m_device, m_allocator,
		makeBufferCreateInfo(resultBufferSize, vk::VK_BUFFER_USAGE_STORAGE_BUFFER_BIT),
		vk::MemoryRequirement::HostVisible);

	{
		const vk::Allocation& alloc = resultBuffer.getAllocation();
		deUint8* resultDataPtr = reinterpret_cast<deUint8*>(alloc.getHostPtr());

		for (deUint32 cmdNdx = 0; cmdNdx < m_dispatchCommands.size(); ++cmdNdx)
		{
			deUint8* const	dstPtr = &resultDataPtr[resultBlockSize*cmdNdx];

			*(deUint32*)(dstPtr + 0 * sizeof(deUint32)) = m_dispatchCommands[cmdNdx].m_numWorkGroups[0];
			*(deUint32*)(dstPtr + 1 * sizeof(deUint32)) = m_dispatchCommands[cmdNdx].m_numWorkGroups[1];
			*(deUint32*)(dstPtr + 2 * sizeof(deUint32)) = m_dispatchCommands[cmdNdx].m_numWorkGroups[2];
			*(deUint32*)(dstPtr + RESULT_BLOCK_NUM_PASSED_OFFSET) = 0;
		}

		vk::flushMappedMemoryRange(m_device_interface, m_device, alloc.getMemory(), alloc.getOffset(), resultBufferSize);
	}

	// Create verify compute shader
	const vk::Unique<vk::VkShaderModule> verifyShader(createShaderModule(
		m_device_interface, m_device, m_context.getBinaryCollection().get("indirect_dispatch_" + m_name + "_verify"), 0u));

	// Create descriptorSetLayout
	vk::DescriptorSetLayoutBuilder layoutBuilder;
	layoutBuilder.addSingleBinding(vk::VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, vk::VK_SHADER_STAGE_COMPUTE_BIT);
	vk::Unique<vk::VkDescriptorSetLayout> descriptorSetLayout(layoutBuilder.build(m_device_interface, m_device));

	// Create compute pipeline
	const vk::Unique<vk::VkPipelineLayout> pipelineLayout(makePipelineLayout(m_device_interface, m_device, *descriptorSetLayout));
	const vk::Unique<vk::VkPipeline> computePipeline(makeComputePipeline(m_device_interface, m_device, *pipelineLayout, *verifyShader));

	// Create descriptor pool
	const vk::Unique<vk::VkDescriptorPool> descriptorPool(
		vk::DescriptorPoolBuilder()
		.addType(vk::VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, (deUint32)m_dispatchCommands.size())
		.build(m_device_interface, m_device, vk::VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT, static_cast<deUint32>(m_dispatchCommands.size())));

	const vk::VkBufferMemoryBarrier ssboPostBarrier = makeBufferMemoryBarrier(
		vk::VK_ACCESS_SHADER_WRITE_BIT, vk::VK_ACCESS_HOST_READ_BIT, *resultBuffer, 0ull, resultBufferSize);

	// Create command buffer
	const vk::Unique<vk::VkCommandPool> cmdPool(makeCommandPool(m_device_interface, m_device, m_queueFamilyIndex));
	const vk::Unique<vk::VkCommandBuffer> cmdBuffer(allocateCommandBuffer(m_device_interface, m_device, *cmdPool, vk::VK_COMMAND_BUFFER_LEVEL_PRIMARY));

	// Begin recording commands
	beginCommandBuffer(m_device_interface, *cmdBuffer);

	// Create indirect buffer
	Buffer indirectBuffer(
		m_device_interface, m_device, m_allocator,
		makeBufferCreateInfo(m_bufferSize, vk::VK_BUFFER_USAGE_INDIRECT_BUFFER_BIT | vk::VK_BUFFER_USAGE_STORAGE_BUFFER_BIT),
		vk::MemoryRequirement::HostVisible);
	fillIndirectBufferData(*cmdBuffer, indirectBuffer);

	// Bind compute pipeline
	m_device_interface.cmdBindPipeline(*cmdBuffer, vk::VK_PIPELINE_BIND_POINT_COMPUTE, *computePipeline);

	// Allocate descriptor sets
	typedef de::SharedPtr<vk::Unique<vk::VkDescriptorSet> > SharedVkDescriptorSet;
	std::vector<SharedVkDescriptorSet> descriptorSets(m_dispatchCommands.size());

	vk::VkDeviceSize curOffset = 0;

	// Create descriptor sets
	for (deUint32 cmdNdx = 0; cmdNdx < m_dispatchCommands.size(); ++cmdNdx)
	{
		descriptorSets[cmdNdx] = SharedVkDescriptorSet(new vk::Unique<vk::VkDescriptorSet>(
									makeDescriptorSet(m_device_interface, m_device, *descriptorPool, *descriptorSetLayout)));

		const vk::VkDescriptorBufferInfo resultDescriptorInfo = makeDescriptorBufferInfo(*resultBuffer, curOffset, resultBlockSize);

		vk::DescriptorSetUpdateBuilder descriptorSetBuilder;
		descriptorSetBuilder.writeSingle(**descriptorSets[cmdNdx], vk::DescriptorSetUpdateBuilder::Location::binding(0u), vk::VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, &resultDescriptorInfo);
		descriptorSetBuilder.update(m_device_interface, m_device);

		// Bind descriptor set
		m_device_interface.cmdBindDescriptorSets(*cmdBuffer, vk::VK_PIPELINE_BIND_POINT_COMPUTE, *pipelineLayout, 0u, 1u, &(**descriptorSets[cmdNdx]), 0u, DE_NULL);

		// Dispatch indirect compute command
		m_device_interface.cmdDispatchIndirect(*cmdBuffer, *indirectBuffer, m_dispatchCommands[cmdNdx].m_offset);

		curOffset += resultBlockSize;
	}

	// Insert memory barrier
	m_device_interface.cmdPipelineBarrier(*cmdBuffer, vk::VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT, vk::VK_PIPELINE_STAGE_HOST_BIT, (vk::VkDependencyFlags)0,
										  0, (const vk::VkMemoryBarrier*)DE_NULL,
										  1, &ssboPostBarrier,
										  0, (const vk::VkImageMemoryBarrier*)DE_NULL);

	// End recording commands
	endCommandBuffer(m_device_interface, *cmdBuffer);

	// Wait for command buffer execution finish
	submitCommandsAndWait(m_device_interface, m_device, m_queue, *cmdBuffer);

	// Check if result buffer contains valid values
	if (verifyResultBuffer(resultBuffer, resultBlockSize, resultBufferSize))
		return tcu::TestStatus(QP_TEST_RESULT_PASS, "Pass");
	else
		return tcu::TestStatus(QP_TEST_RESULT_FAIL, "Invalid values in result buffer");
}